

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O0

int ts_subtree_compare(Subtree left,Subtree right)

{
  TSSymbol TVar1;
  TSSymbol TVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  Subtree right_child;
  Subtree left_child;
  uint32_t n;
  uint32_t i;
  Subtree right_local;
  Subtree left_local;
  
  TVar1 = ts_subtree_symbol(left);
  TVar2 = ts_subtree_symbol(right);
  if (TVar1 < TVar2) {
    left_local._4_4_ = 0xffffffff;
  }
  else {
    TVar1 = ts_subtree_symbol(right);
    TVar2 = ts_subtree_symbol(left);
    if (TVar1 < TVar2) {
      left_local._4_4_ = 1;
    }
    else {
      uVar3 = ts_subtree_child_count(left);
      uVar4 = ts_subtree_child_count(right);
      if (uVar3 < uVar4) {
        left_local._4_4_ = 0xffffffff;
      }
      else {
        uVar3 = ts_subtree_child_count(right);
        uVar4 = ts_subtree_child_count(left);
        if (uVar3 < uVar4) {
          left_local._4_4_ = 1;
        }
        else {
          left_child._4_4_ = 0;
          uVar3 = ts_subtree_child_count(left);
          for (; (uint)left_child._4_4_ < uVar3; left_child._4_4_ = left_child._4_4_ + 1) {
            iVar5 = ts_subtree_compare(((left.ptr)->field_17).field_0.children
                                       [(uint)left_child._4_4_],
                                       ((right.ptr)->field_17).field_0.children
                                       [(uint)left_child._4_4_]);
            if (iVar5 == -1) {
              return -1;
            }
            if (iVar5 == 1) {
              return 1;
            }
          }
          left_local._4_4_ = 0;
        }
      }
    }
  }
  return left_local._4_4_;
}

Assistant:

int ts_subtree_compare(Subtree left, Subtree right) {
  if (ts_subtree_symbol(left) < ts_subtree_symbol(right)) return -1;
  if (ts_subtree_symbol(right) < ts_subtree_symbol(left)) return 1;
  if (ts_subtree_child_count(left) < ts_subtree_child_count(right)) return -1;
  if (ts_subtree_child_count(right) < ts_subtree_child_count(left)) return 1;
  for (uint32_t i = 0, n = ts_subtree_child_count(left); i < n; i++) {
    Subtree left_child = left.ptr->children[i];
    Subtree right_child = right.ptr->children[i];
    switch (ts_subtree_compare(left_child, right_child)) {
      case -1: return -1;
      case 1: return 1;
      default: break;
    }
  }
  return 0;
}